

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalGhsMultiGenerator::GetToolset
          (cmGlobalGhsMultiGenerator *this,cmMakefile *mf,string *tsd,string *ts)

{
  bool bVar1;
  string tryPath;
  string msg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  output;
  string local_78;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"GHS_TOOLSET_ROOT",(allocator<char> *)&local_58);
  cmMakefile::GetDefinition(mf,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::assign((char *)tsd);
  if (ts->_M_string_length == 0) {
    local_38._M_dataplus._M_p = (pointer)0x0;
    local_38._M_string_length = 0;
    local_38.field_2._M_allocated_capacity = 0;
    if ((tsd->_M_dataplus)._M_p[tsd->_M_string_length - 1] != '/') {
      std::__cxx11::string::append((char *)tsd);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"comp_[^;]+",(allocator<char> *)&local_58);
    cmSystemTools::Glob(tsd,&local_78,
                        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_38);
    std::__cxx11::string::~string((string *)&local_78);
    if (local_38._M_dataplus._M_p == (pointer)local_38._M_string_length) {
      std::operator+(&local_58,"No GHS toolsets found in GHS_TOOLSET_ROOT \"",tsd);
      std::operator+(&local_78,&local_58,"\".");
      std::__cxx11::string::~string((string *)&local_58);
      cmSystemTools::Error(&local_78);
      std::__cxx11::string::assign((char *)tsd);
      std::__cxx11::string::~string((string *)&local_78);
    }
    else {
      std::__cxx11::string::append((string *)tsd);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_38);
  }
  else {
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    local_78._M_string_length = 0;
    local_78.field_2._M_local_buf[0] = '\0';
    cmsys::SystemTools::CollapseFullPath(&local_58,ts,tsd);
    std::__cxx11::string::operator=((string *)&local_78,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    bVar1 = cmsys::SystemTools::FileExists(&local_78);
    if (bVar1) {
      std::__cxx11::string::_M_assign((string *)tsd);
    }
    else {
      std::operator+(&local_38,"GHS toolset \"",&local_78);
      std::operator+(&local_58,&local_38,"\" not found.");
      std::__cxx11::string::~string((string *)&local_38);
      cmSystemTools::Error(&local_58);
      std::__cxx11::string::assign((char *)tsd);
      std::__cxx11::string::~string((string *)&local_58);
    }
    std::__cxx11::string::~string((string *)&local_78);
  }
  return;
}

Assistant:

void cmGlobalGhsMultiGenerator::GetToolset(cmMakefile* mf, std::string& tsd,
                                           const std::string& ts)
{
  const char* ghsRoot = mf->GetDefinition("GHS_TOOLSET_ROOT");

  if (!ghsRoot || ghsRoot[0] == '\0') {
    ghsRoot = DEFAULT_TOOLSET_ROOT;
  }
  tsd = ghsRoot;

  if (ts.empty()) {
    std::vector<std::string> output;

    // Use latest? version
    if (tsd.back() != '/') {
      tsd += "/";
    }
    cmSystemTools::Glob(tsd, "comp_[^;]+", output);

    if (output.empty()) {
      std::string msg =
        "No GHS toolsets found in GHS_TOOLSET_ROOT \"" + tsd + "\".";
      cmSystemTools::Error(msg);
      tsd = "";
    } else {
      tsd += output.back();
    }
  } else {
    std::string tryPath;
    tryPath = cmSystemTools::CollapseFullPath(ts, tsd);
    if (!cmSystemTools::FileExists(tryPath)) {
      std::string msg = "GHS toolset \"" + tryPath + "\" not found.";
      cmSystemTools::Error(msg);
      tsd = "";
    } else {
      tsd = tryPath;
    }
  }
}